

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

void Spl_ManStop(Spl_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  
  Gia_ManStaticFanoutStop(p->pGia);
  pGVar1 = p->pGia;
  if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x99,"void Spl_ManStop(Spl_Man_t *)");
  }
  if (pGVar1->vMapping2 != (Vec_Wec_t *)0x0) {
    pVVar2 = Spl_ManFromWecMapping(pGVar1,pGVar1->vMapping2);
    pGVar1 = p->pGia;
    pGVar1->vMapping = pVVar2;
    __ptr = pGVar1->vMapping2;
    if (__ptr != (Vec_Wec_t *)0x0) {
      pVVar2 = __ptr->pArray;
      lVar3 = 8;
      for (lVar4 = 0; lVar4 < __ptr->nCap; lVar4 = lVar4 + 1) {
        __ptr_00 = *(void **)((long)&pVVar2->nCap + lVar3);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          pVVar2 = __ptr->pArray;
          *(undefined8 *)((long)&pVVar2->nCap + lVar3) = 0;
        }
        lVar3 = lVar3 + 0x10;
      }
      free(pVVar2);
      free(__ptr);
      pGVar1->vMapping2 = (Vec_Wec_t *)0x0;
    }
    Vec_BitFree(p->vMarksCIO);
    Vec_BitFree(p->vMarksIn);
    Vec_BitFree(p->vMarksNo);
    Vec_BitFree(p->vMarksAnd);
    Vec_IntFree(p->vRoots);
    Vec_IntFree(p->vNodes);
    Vec_IntFree(p->vLeaves);
    Vec_IntFree(p->vAnds);
    Vec_IntFree(p->vFanouts);
    Vec_IntFree(p->vCands);
    Vec_IntFree(p->vInputs);
    free(p);
    return;
  }
  __assert_fail("Gia_ManHasMapping2(p->pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                ,0x9a,"void Spl_ManStop(Spl_Man_t *)");
}

Assistant:

void Spl_ManStop( Spl_Man_t * p )
{
    // fanout
    Gia_ManStaticFanoutStop( p->pGia );
    // mapping
    assert( !Gia_ManHasMapping(p->pGia) );
    assert( Gia_ManHasMapping2(p->pGia) );
    p->pGia->vMapping = Spl_ManFromWecMapping( p->pGia, p->pGia->vMapping2 );
    Vec_WecFreeP( &p->pGia->vMapping2 );
    // intermediate
    Vec_BitFree( p->vMarksCIO );
    Vec_BitFree( p->vMarksIn );
    Vec_BitFree( p->vMarksNo );
    Vec_BitFree( p->vMarksAnd );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    // temporary 
    Vec_IntFree( p->vFanouts );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vInputs );
    ABC_FREE( p );
}